

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tabs.cxx
# Opt level: O0

int __thiscall Fl_Tabs::push(Fl_Tabs *this,Fl_Widget *o)

{
  uint uVar1;
  Fl_Widget *o_local;
  Fl_Tabs *this_local;
  
  if (this->push_ != o) {
    if (((this->push_ != (Fl_Widget *)0x0) && (uVar1 = Fl_Widget::visible(this->push_), uVar1 == 0))
       || ((o != (Fl_Widget *)0x0 && (uVar1 = Fl_Widget::visible(o), uVar1 == 0)))) {
      redraw_tabs(this);
    }
    this->push_ = o;
    return 1;
  }
  return 0;
}

Assistant:

int Fl_Tabs::push(Fl_Widget *o) {
  if (push_ == o) return 0;
  if ( (push_ && !push_->visible()) || (o && !o->visible()) )
    redraw_tabs();
  push_ = o;
  return 1;
}